

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_splittingstep_coefficients.c
# Opt level: O1

SplittingStepCoefficients
SplittingStepCoefficients_Create
          (int sequential_methods,int stages,int partitions,int order,sunrealtype *alpha,
          sunrealtype *beta)

{
  SplittingStepCoefficients pSVar1;
  
  pSVar1 = (SplittingStepCoefficients)0x0;
  if (((0 < order) && (alpha != (sunrealtype *)0x0)) && (beta != (sunrealtype *)0x0)) {
    pSVar1 = SplittingStepCoefficients_Alloc(sequential_methods,stages,partitions);
    if (pSVar1 == (SplittingStepCoefficients)0x0) {
      pSVar1 = (SplittingStepCoefficients)0x0;
    }
    else {
      pSVar1->order = order;
      memcpy(pSVar1->alpha,alpha,(long)sequential_methods << 3);
      memcpy(**pSVar1->beta,beta,(long)(partitions * sequential_methods * (stages + 1)) << 3);
    }
  }
  return pSVar1;
}

Assistant:

SplittingStepCoefficients SplittingStepCoefficients_Create(
  const int sequential_methods, const int stages, const int partitions,
  const int order, sunrealtype* const alpha, sunrealtype* const beta)
{
  if (alpha == NULL || beta == NULL || order < 1) { return NULL; }

  SplittingStepCoefficients coefficients =
    SplittingStepCoefficients_Alloc(sequential_methods, stages, partitions);
  if (coefficients == NULL) { return NULL; }

  coefficients->order = order;
  memcpy(coefficients->alpha, alpha, sequential_methods * sizeof(sunrealtype));
  memcpy(coefficients->beta[0][0], beta,
         sequential_methods * (stages + 1) * partitions * sizeof(sunrealtype));

  return coefficients;
}